

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O0

int __thiscall Group::build(Group *this,int *v,int vn,int c)

{
  anon_class_16_2_fd512dd0 __comp;
  int iVar1;
  int iVar2;
  float *pfVar3;
  reference pvVar4;
  vector<BoundingBox,_std::allocator<BoundingBox>_> *pvVar5;
  undefined4 in_ECX;
  int in_EDX;
  Group *in_RSI;
  Group *in_RDI;
  float ma;
  int i_2;
  float mxx;
  int I;
  int i_1;
  int i;
  int p;
  BoundingBox *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int iVar6;
  undefined4 in_stack_fffffffffffffed4;
  int *in_stack_fffffffffffffef8;
  reference in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff10;
  float local_c0;
  float local_bc;
  float local_b8;
  int local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  int local_a4;
  int local_70;
  int local_3c;
  undefined1 *local_30;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_EDX == 1) {
    local_4 = *(int *)&(in_RSI->obj).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
  }
  else {
    local_4 = in_RDI->bn;
    in_RDI->bn = local_4 + 1;
    local_30 = &stack0xffffffffffffffe0;
    __comp.c = in_stack_ffffffffffffff10;
    __comp.this = in_RDI;
    std::sort<int*,Group::build(int*,int,int)::_lambda(int,int)_1_>
              ((int *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,__comp);
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t1,0);
    BoundingBox::operator=
              ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      in_stack_ffffffffffffff00 =
           std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[]
                     (&in_RDI->t1,(long)local_3c);
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[]
                (&in_RDI->box,
                 (long)*(int *)((long)&(in_RSI->obj).
                                       super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start + (long)local_3c * 4
                               ));
      BoundingBox::BoundingBox
                ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      BoundingBox::operator|((BoundingBox *)in_RDI,in_stack_ffffffffffffff00);
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[]
                (&in_RDI->t1,(long)(local_3c + 1));
      BoundingBox::operator=
                ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
    }
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t2,(long)in_EDX);
    BoundingBox::operator=
              ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    iVar6 = in_EDX;
    while (local_70 = iVar6 + -1, -1 < local_70) {
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t2,(long)iVar6);
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[]
                (&in_RDI->box,
                 (long)*(int *)((long)&(in_RSI->obj).
                                       super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                                       _M_impl.super__Vector_impl_data._M_start + (long)local_70 * 4
                               ));
      BoundingBox::BoundingBox
                ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      BoundingBox::operator|((BoundingBox *)in_RDI,in_stack_ffffffffffffff00);
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t2,(long)local_70)
      ;
      BoundingBox::operator=
                ((BoundingBox *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
      iVar6 = local_70;
    }
    local_a4 = in_EDX / 2;
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t1,(long)local_a4);
    local_ac = BoundingBox::area((BoundingBox *)in_RDI);
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t2,(long)local_a4);
    local_b0 = BoundingBox::area((BoundingBox *)in_RDI);
    pfVar3 = std::max<float>(&local_ac,&local_b0);
    local_a8 = *pfVar3;
    for (local_b4 = 1; local_b4 < in_EDX; local_b4 = local_b4 + 1) {
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t1,(long)local_b4)
      ;
      local_bc = BoundingBox::area((BoundingBox *)in_RDI);
      std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->t2,(long)local_b4)
      ;
      local_c0 = BoundingBox::area((BoundingBox *)in_RDI);
      pfVar3 = std::max<float>(&local_bc,&local_c0);
      local_b8 = *pfVar3;
      if (local_b8 < local_a8) {
        local_a4 = local_b4;
        local_a8 = local_b8;
      }
    }
    iVar6 = local_a4;
    iVar1 = build(in_RSI,(int *)CONCAT44(in_EDX,in_ECX),local_4,in_stack_ffffffffffffffd8);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ch,(long)(local_4 << 1));
    *pvVar4 = iVar1;
    iVar2 = build(in_RSI,(int *)CONCAT44(in_EDX,in_ECX),local_4,in_stack_ffffffffffffffd8);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ch,(long)(local_4 * 2 + 1))
    ;
    *pvVar4 = iVar2;
    pvVar5 = &in_RDI->box;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ch,(long)(local_4 << 1));
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](pvVar5,(long)*pvVar4);
    pvVar5 = &in_RDI->box;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->ch,(long)(local_4 * 2 + 1))
    ;
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](pvVar5,(long)*pvVar4);
    BoundingBox::BoundingBox((BoundingBox *)CONCAT44(iVar1,iVar6),in_stack_fffffffffffffec8);
    BoundingBox::operator|((BoundingBox *)in_RDI,in_stack_ffffffffffffff00);
    std::vector<BoundingBox,_std::allocator<BoundingBox>_>::operator[](&in_RDI->box,(long)local_4);
    BoundingBox::operator=((BoundingBox *)CONCAT44(iVar1,iVar6),in_stack_fffffffffffffec8);
  }
  return local_4;
}

Assistant:

int build(int* v,int vn,int c=0)
	{
//		cerr << vn << "!" << v[0] << "!!\n";
//		for (int j = 0; j < vn; ++j) cerr << v[j] << "|"; cerr << "EZ\n";
		if (vn == 1) return v[0];
		int p = bn++;
		std::sort(v,v+vn, [&](int p, int q) {return box[p].a[c] + box[p].b[c] < box[q].a[c] + box[q].b[c]; });
		t1[0] = BoundingBox::EMPTY;
		for (int i = 0; i < vn; ++i)
			t1[i+1] = t1[i] | box[v[i]];
		t2[vn] = BoundingBox::EMPTY;
		for (int i = vn - 1; i >= 0; --i)
			t2[i] = t2[i + 1] | box[v[i]];
		int I=vn/2;
		float mxx = std::max(t1[I].area(),t2[I].area());
		for (int i = 1; i < vn; ++i)
		{
			float ma = std::max(t1[i].area(), t2[i].area());
			if (ma < mxx) mxx = ma, I = i;
		}
		ch[p * 2] = build(v, I, (c+1)%3);
//		cerr << p << "FIRSTHALF ED\n";
		ch[p * 2 + 1] = build(v + I, vn - I,(c+1)%3);
		box[p] = box[ch[p * 2]] | box[ch[p * 2 + 1]];
		return p;
	}